

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_SlashUnicodeUpper_Test::~JsonString_SlashUnicodeUpper_Test
          (JsonString_SlashUnicodeUpper_Test *this)

{
  JsonString_SlashUnicodeUpper_Test *this_local;
  
  ~JsonString_SlashUnicodeUpper_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, SlashUnicodeUpper) {
    EXPECT_CALL (callbacks_, string_value ("/")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input ("\"\\u002F\"").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{9U, 1U}));
}